

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::elementDecl
          (AbstractDOMParser *this,DTDElementDecl *decl,bool param_2)

{
  XMLBuffer *pXVar1;
  XMLSize_t XVar2;
  bool bVar3;
  int iVar4;
  XMLCh *chars;
  undefined4 extraout_var;
  
  bVar3 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar3) {
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'<';
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'!';
    XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgElemString);
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L' ';
    pXVar1 = this->fInternalSubset;
    chars = QName::getRawName((decl->super_XMLElementDecl).fElementName);
    XMLBuffer::append(pXVar1,chars);
    iVar4 = (*(decl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])(decl);
    if ((XMLCh *)CONCAT44(extraout_var,iVar4) != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)CONCAT44(extraout_var,iVar4));
    }
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::elementDecl
(
    const   DTDElementDecl& decl
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgElemString);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(decl.getFullName());

        //get the ContentSpec information
        const XMLCh* contentModel = decl.getFormattedContentModel();
        if (contentModel != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(contentModel);
        }

        fInternalSubset.append(chCloseAngle);
    }
}